

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.cc
# Opt level: O3

int main_body<dynet::GRUBuilder>(variables_map *vm)

{
  variables_map *this;
  _Base_ptr p_Var1;
  LookupParameter *pLVar2;
  float fVar3;
  uint uVar4;
  int iVar5;
  pointer piVar6;
  pointer piVar7;
  pointer piVar8;
  size_type sVar9;
  pointer pcVar10;
  pointer piVar11;
  pointer piVar12;
  size_type sVar13;
  size_type sVar14;
  int iVar15;
  Trainer TVar16;
  __pid_t _Var17;
  tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int> *sent;
  const_iterator cVar18;
  any *paVar19;
  uint *puVar20;
  const_iterator cVar21;
  const_iterator cVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar23;
  ostream *poVar24;
  pointer ptVar25;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar26;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar27;
  ulong uVar28;
  void *pvVar29;
  Trainer *sgd;
  float *pfVar30;
  Trainer *pTVar31;
  int *piVar32;
  char *pcVar33;
  _Alloc_hider _Var34;
  bool bVar35;
  bool _global_fertility;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  bool local_699;
  key_type local_698;
  _Base_ptr local_678;
  key_type local_670;
  ulong local_650;
  ulong local_648;
  _Base_ptr local_640;
  string fname;
  Corpus local_618;
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  local_5f8;
  Corpus local_5d8;
  _Base_ptr local_5c0;
  key_type local_5b8;
  string flavour;
  string local_578;
  Model model;
  undefined7 uStack_557;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_548 [7];
  AttentionalModel<dynet::GRUBuilder> am;
  string local_b0;
  string local_90;
  key_type local_70;
  string line;
  
  pLVar2 = &am.p_ct;
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"<s>","");
  kSRC_SOS = dynet::Dict::convert(&sd,(string *)&am);
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"</s>","");
  kSRC_EOS = dynet::Dict::convert(&sd,(string *)&am);
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"<s>","");
  kTGT_SOS = dynet::Dict::convert(&td,(string *)&am);
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"</s>","");
  kTGT_EOS = dynet::Dict::convert(&td,(string *)&am);
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"verbose","");
  this = vm + 0x10;
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)this,(key_type *)&am);
  p_Var1 = (_Base_ptr)(vm + 0x18);
  verbose = cVar18._M_node != p_Var1;
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"layers","");
  paVar19 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
  puVar20 = (uint *)boost::any_cast<int_const&>(paVar19);
  LAYERS = *puVar20;
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"align","");
  paVar19 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
  puVar20 = (uint *)boost::any_cast<int_const&>(paVar19);
  ALIGN_DIM = *puVar20;
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"hidden","");
  paVar19 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
  puVar20 = (uint *)boost::any_cast<int_const&>(paVar19);
  HIDDEN_DIM = *puVar20;
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"bidirectional","");
  local_640 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                      *)this,(key_type *)&am);
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"giza","");
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)this,(key_type *)&am);
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  local_699 = true;
  local_648 = CONCAT71(local_648._1_7_,1);
  local_650 = CONCAT71(local_650._1_7_,1);
  if (cVar18._M_node == p_Var1) {
    am._0_8_ = pLVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&am,"gz-position","");
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)this,(key_type *)&am);
    if ((LookupParameter *)am._0_8_ != pLVar2) {
      operator_delete((void *)am._0_8_);
    }
    am._0_8_ = pLVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&am,"gz-markov","");
    cVar21 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)this,(key_type *)&am);
    if ((LookupParameter *)am._0_8_ != pLVar2) {
      operator_delete((void *)am._0_8_);
    }
    am._0_8_ = pLVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&am,"gz-fertility","");
    cVar22 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)this,(key_type *)&am);
    local_699 = cVar22._M_node != p_Var1;
    local_650 = CONCAT71(local_650._1_7_,cVar21._M_node != p_Var1);
    local_648 = CONCAT71(local_648._1_7_,cVar18._M_node != p_Var1);
    if ((LookupParameter *)am._0_8_ != pLVar2) {
      operator_delete((void *)am._0_8_);
    }
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"fertility","");
  local_5c0 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                      *)this,(key_type *)&am);
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"swap","");
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)this,(key_type *)&am);
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"document","");
  local_678 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                      *)this,(key_type *)&am);
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  flavour._M_dataplus._M_p = (pointer)&flavour.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&flavour,"RNN","");
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"lstm","");
  cVar21 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)this,(key_type *)&am);
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  if (cVar21._M_node == p_Var1) {
    am._0_8_ = pLVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&am,"gru","");
    cVar21 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)this,(key_type *)&am);
    if ((LookupParameter *)am._0_8_ != pLVar2) {
      operator_delete((void *)am._0_8_);
    }
    if (cVar21._M_node != p_Var1) {
      pcVar33 = "GRU";
      goto LAB_00128013;
    }
  }
  else {
    pcVar33 = "LSTM";
LAB_00128013:
    std::__cxx11::string::_M_replace
              ((ulong)&flavour,0,(char *)flavour._M_string_length,(ulong)pcVar33);
  }
  line._M_dataplus._M_p = (pointer)&line.field_2;
  local_5d8.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_618.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5f8.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  line._M_string_length = 0;
  local_5d8.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5d8.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_618.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_618.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5f8.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5f8.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  line.field_2._M_local_buf[0] = '\0';
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Reading training data from ",0x1b);
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"train","");
  paVar19 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
  pbVar23 = boost::any_cast<std::__cxx11::string_const&>(paVar19);
  poVar24 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,(pbVar23->_M_dataplus)._M_p,pbVar23->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar24,"...\n",4);
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"train","");
  paVar19 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
  pbVar23 = boost::any_cast<std::__cxx11::string_const&>(paVar19);
  read_corpus((Corpus *)&fname,pbVar23,local_678 != p_Var1);
  local_548[0]._0_8_ =
       local_5d8.
       super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  _model = (pointer)local_5d8.
                    super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  local_5d8.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)fname.field_2._M_allocated_capacity;
  fname.field_2._M_allocated_capacity = 0;
  local_5d8.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)fname._M_dataplus._M_p;
  local_5d8.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)fname._M_string_length;
  fname._0_16_ = ZEXT816(0) << 0x20;
  std::
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::~vector((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
             *)&model);
  std::
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::~vector((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
             *)&fname);
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  td.frozen = true;
  sd.frozen = true;
  SRC_VOCAB_SIZE =
       (uint)((ulong)((long)sd.words_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)sd.words_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5);
  TGT_VOCAB_SIZE =
       (uint)((ulong)((long)td.words_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)td.words_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5);
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"devel","");
  cVar21 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)this,(key_type *)&am);
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  if (cVar21._M_node != p_Var1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Reading dev data from ",0x16);
    am._0_8_ = pLVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&am,"devel","");
    paVar19 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    pbVar23 = boost::any_cast<std::__cxx11::string_const&>(paVar19);
    poVar24 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(pbVar23->_M_dataplus)._M_p,pbVar23->_M_string_length
                        );
    std::__ostream_insert<char,std::char_traits<char>>(poVar24,"...\n",4);
    if ((LookupParameter *)am._0_8_ != pLVar2) {
      operator_delete((void *)am._0_8_);
    }
    am._0_8_ = pLVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&am,"devel","");
    paVar19 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    pbVar23 = boost::any_cast<std::__cxx11::string_const&>(paVar19);
    read_corpus((Corpus *)&fname,pbVar23,local_678 != p_Var1);
    local_548[0]._0_8_ =
         local_618.
         super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    _model = (pointer)local_618.
                      super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    local_618.
    super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)fname.field_2._M_allocated_capacity;
    fname.field_2._M_allocated_capacity = 0;
    local_618.
    super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)fname._M_dataplus._M_p;
    local_618.
    super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)fname._M_string_length;
    fname._0_16_ = ZEXT816(0) << 0x20;
    std::
    vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ::~vector((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
               *)&model);
    std::
    vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ::~vector((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
               *)&fname);
    if ((LookupParameter *)am._0_8_ != pLVar2) {
      operator_delete((void *)am._0_8_);
    }
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"test","");
  cVar21 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)this,(key_type *)&am);
  if (cVar21._M_node == p_Var1) {
    bVar35 = false;
  }
  else {
    _model = (pointer)local_548;
    std::__cxx11::string::_M_construct<char_const*>((string *)&model,"rescore","");
    cVar21 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)this,(key_type *)&model);
    bVar35 = cVar21._M_node != p_Var1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_model != local_548) {
      operator_delete(_model);
    }
  }
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  if (bVar35) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Reading test examples from ",0x1b);
    am._0_8_ = pLVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&am,"test","");
    paVar19 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    pbVar23 = boost::any_cast<std::__cxx11::string_const&>(paVar19);
    poVar24 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(pbVar23->_M_dataplus)._M_p,pbVar23->_M_string_length
                        );
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar24 + -0x18) + (char)poVar24);
    std::ostream::put((char)poVar24);
    std::ostream::flush();
    if ((LookupParameter *)am._0_8_ != pLVar2) {
      operator_delete((void *)am._0_8_);
    }
    am._0_8_ = pLVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&am,"test","");
    paVar19 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    pbVar23 = boost::any_cast<std::__cxx11::string_const&>(paVar19);
    read_corpus((Corpus *)&fname,pbVar23,local_678 != p_Var1);
    local_548[0]._0_8_ =
         local_5f8.
         super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    _model = (pointer)local_5f8.
                      super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    local_5f8.
    super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)fname.field_2._M_allocated_capacity;
    fname.field_2._M_allocated_capacity = 0;
    local_5f8.
    super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)fname._M_dataplus._M_p;
    local_5f8.
    super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)fname._M_string_length;
    fname._0_16_ = ZEXT816(0) << 0x20;
    std::
    vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ::~vector((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
               *)&model);
    std::
    vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ::~vector((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
               *)&fname);
    if ((LookupParameter *)am._0_8_ != pLVar2) {
      operator_delete((void *)am._0_8_);
    }
  }
  if (cVar18._M_node != p_Var1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Swapping role of source and target\n",0x23);
    std::swap<dynet::Dict>(&sd,&td);
    iVar15 = kSRC_EOS;
    iVar5 = kSRC_SOS;
    uVar4 = SRC_VOCAB_SIZE;
    kSRC_SOS = kTGT_SOS;
    kTGT_SOS = iVar5;
    kSRC_EOS = kTGT_EOS;
    kTGT_EOS = iVar15;
    SRC_VOCAB_SIZE = TGT_VOCAB_SIZE;
    TGT_VOCAB_SIZE = uVar4;
    for (ptVar25 = local_5d8.
                   super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_618.
                     super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
        ptVar25 !=
        local_5d8.
        super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; ptVar25 = ptVar25 + 1) {
      piVar11 = (ptVar25->
                super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                ).super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
                super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      piVar12 = *(pointer *)
                 ((long)&(ptVar25->
                         super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                         ).super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
                         super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>.
                         _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data + 8);
      piVar6 = (ptVar25->
               super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
               ).super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      piVar7 = (ptVar25->
               super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
               ).super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      piVar8 = (ptVar25->
               super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
               ).super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage;
      (ptVar25->
      super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
      ).super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           *(pointer *)
            ((long)&(ptVar25->
                    super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                    ).super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
                    super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>.
                    _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data + 0x10);
      (ptVar25->
      super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
      ).super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
      super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           piVar6;
      *(pointer *)
       ((long)&(ptVar25->
               super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
               ).super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
               super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data + 8) =
           piVar7;
      *(pointer *)
       ((long)&(ptVar25->
               super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
               ).super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
               super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data + 0x10)
           = piVar8;
      (ptVar25->
      super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
      ).super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           piVar11;
      (ptVar25->
      super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
      ).super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           piVar12;
    }
    for (; paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_5f8.
                        super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
        paVar26 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_618.
           super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
        paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar26 + 0x38)) {
      sVar13 = *(size_type *)((long)paVar26 + 8);
      sVar14 = paVar26[1]._M_allocated_capacity;
      sVar9 = paVar26[3]._M_allocated_capacity;
      paVar26[3]._M_allocated_capacity = *(size_type *)((long)paVar26 + 0x18);
      *(size_type *)((long)paVar26 + 8) = paVar26[2]._M_allocated_capacity;
      paVar26[1]._M_allocated_capacity = *(size_type *)((long)paVar26 + 0x28);
      *(size_type *)((long)paVar26 + 0x18) = sVar9;
      paVar26[2]._M_allocated_capacity = sVar13;
      *(size_type *)((long)paVar26 + 0x28) = sVar14;
    }
    for (; paVar27 !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_5f8.
              super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
        paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar27 + 0x38)) {
      sVar13 = *(size_type *)((long)paVar27 + 8);
      sVar14 = paVar27[1]._M_allocated_capacity;
      sVar9 = paVar27[3]._M_allocated_capacity;
      paVar27[3]._M_allocated_capacity = *(size_type *)((long)paVar27 + 0x18);
      *(size_type *)((long)paVar27 + 8) = paVar27[2]._M_allocated_capacity;
      paVar27[1]._M_allocated_capacity = *(size_type *)((long)paVar27 + 0x28);
      *(size_type *)((long)paVar27 + 0x18) = sVar9;
      paVar27[2]._M_allocated_capacity = sVar13;
      *(size_type *)((long)paVar27 + 0x28) = sVar14;
    }
  }
  fname._M_string_length = 0;
  fname._M_dataplus._M_p = (pointer)&fname.field_2;
  fname.field_2._M_allocated_capacity = fname.field_2._M_allocated_capacity & 0xffffffffffffff00;
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"parameters","");
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)this,(key_type *)&am);
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  uVar28 = local_650 & 0xff;
  bVar35 = local_648._0_1_;
  local_650 = (ulong)local_699;
  local_648 = uVar28;
  if (cVar18._M_node == p_Var1) {
    am._0_8_ = pLVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&am,"initialise","");
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)this,(key_type *)&am);
    if ((LookupParameter *)am._0_8_ != pLVar2) {
      operator_delete((void *)am._0_8_);
    }
    if (cVar18._M_node != p_Var1) {
      am._0_8_ = pLVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&am,"initialise","");
      paVar19 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
      boost::any_cast<std::__cxx11::string_const&>(paVar19);
      std::__cxx11::string::_M_assign((string *)&fname);
      goto joined_r0x00128827;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&am);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&am,"am",2);
    model = (Model)0x5f;
    poVar24 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&am,(char *)&model,1);
    poVar24 = std::ostream::_M_insert<unsigned_long>((ulong)poVar24);
    model = (Model)0x5f;
    poVar24 = std::__ostream_insert<char,std::char_traits<char>>(poVar24,(char *)&model,1);
    poVar24 = std::ostream::_M_insert<unsigned_long>((ulong)poVar24);
    model = (Model)0x5f;
    poVar24 = std::__ostream_insert<char,std::char_traits<char>>(poVar24,(char *)&model,1);
    poVar24 = std::ostream::_M_insert<unsigned_long>((ulong)poVar24);
    model = (Model)0x5f;
    poVar24 = std::__ostream_insert<char,std::char_traits<char>>(poVar24,(char *)&model,1);
    poVar24 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar24,flavour._M_dataplus._M_p,flavour._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar24,"_b",2);
    poVar24 = std::ostream::_M_insert<bool>(SUB81(poVar24,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar24,"_g",2);
    pvVar29 = (void *)std::ostream::operator<<(poVar24,(uint)bVar35);
    pvVar29 = (void *)std::ostream::operator<<(pvVar29,(int)local_648);
    poVar24 = (ostream *)std::ostream::operator<<(pvVar29,(int)local_650);
    std::__ostream_insert<char,std::char_traits<char>>(poVar24,"_d",2);
    poVar24 = std::ostream::_M_insert<bool>(SUB81(poVar24,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar24,"-pid",4);
    _Var17 = getpid();
    poVar24 = (ostream *)std::ostream::operator<<(poVar24,_Var17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar24,".params",7);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&fname,(string *)&model);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_model != local_548) {
      operator_delete(_model);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&am);
    std::ios_base::~ios_base((ios_base *)&am.p_Wa);
  }
  else {
    am._0_8_ = pLVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&am,"parameters","");
    paVar19 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    boost::any_cast<std::__cxx11::string_const&>(paVar19);
    std::__cxx11::string::_M_assign((string *)&fname);
joined_r0x00128827:
    if ((LookupParameter *)am._0_8_ != pLVar2) {
      operator_delete((void *)am._0_8_);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Parameters will be written to: ",0x1f);
  poVar24 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,fname._M_dataplus._M_p,fname._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar24 + -0x18) + (char)poVar24);
  std::ostream::put((char)poVar24);
  std::ostream::flush();
  dynet::Model::Model(&model);
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"sgd_trainer","");
  paVar19 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
  puVar20 = boost::any_cast<unsigned_int_const&>(paVar19);
  uVar4 = *puVar20;
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  switch(uVar4) {
  case 0:
    sgd = (Trainer *)operator_new(0x40);
    am._0_8_ = pLVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&am,"lr_eta","");
    paVar19 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    pfVar30 = boost::any_cast<float_const&>(paVar19);
    fVar3 = *pfVar30;
    *(float *)(sgd + 8) = fVar3;
    *(float *)(sgd + 0xc) = fVar3;
    *(undefined8 *)(sgd + 0x10) = 0;
    sgd[0x18] = (Trainer)0x1;
    *(undefined4 *)(sgd + 0x1c) = 0x40a00000;
    *(undefined8 *)(sgd + 0x20) = 0;
    *(undefined8 *)(sgd + 0x28) = 0;
    *(undefined2 *)(sgd + 0x30) = 1;
    *(Model **)(sgd + 0x38) = &model;
    *(code **)sgd = std::streambuf::xsgetn;
    goto joined_r0x00128d13;
  case 1:
    sgd = (Trainer *)operator_new(0x78);
    am._0_8_ = pLVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&am,"lr_eta","");
    paVar19 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    pfVar30 = boost::any_cast<float_const&>(paVar19);
    fVar3 = *pfVar30;
    *(float *)(sgd + 8) = fVar3;
    *(float *)(sgd + 0xc) = fVar3;
    auVar37._0_12_ = ZEXT812(0);
    auVar37._12_4_ = 0;
    *(undefined8 *)(sgd + 0x10) = 0;
    sgd[0x18] = (Trainer)0x1;
    *(undefined4 *)(sgd + 0x1c) = 0x40a00000;
    *(undefined1 (*) [16])(sgd + 0x20) = auVar37;
    *(undefined2 *)(sgd + 0x30) = 1;
    *(Model **)(sgd + 0x38) = &model;
    *(code **)sgd = dynet::expr::rectify;
    *(undefined4 *)(sgd + 0x40) = 0x3f666666;
    *(undefined1 (*) [32])(sgd + 0x48) = ZEXT432(0);
    *(undefined1 (*) [32])(sgd + 0x58) = ZEXT432(0);
    goto joined_r0x00128c61;
  case 2:
    sgd = (Trainer *)operator_new(0x78);
    am._0_8_ = pLVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&am,"lr_eta","");
    paVar19 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    pfVar30 = boost::any_cast<float_const&>(paVar19);
    fVar3 = *pfVar30;
    *(float *)(sgd + 8) = fVar3;
    *(float *)(sgd + 0xc) = fVar3;
    auVar36._0_12_ = ZEXT812(0);
    auVar36._12_4_ = 0;
    *(undefined8 *)(sgd + 0x10) = 0;
    sgd[0x18] = (Trainer)0x1;
    *(undefined4 *)(sgd + 0x1c) = 0x40a00000;
    *(undefined1 (*) [16])(sgd + 0x20) = auVar36;
    *(undefined2 *)(sgd + 0x30) = 1;
    *(Model **)(sgd + 0x38) = &model;
    *(code **)sgd = dynet::expr::operator+;
    *(undefined4 *)(sgd + 0x40) = 0x1e3ce508;
    *(undefined1 (*) [32])(sgd + 0x48) = ZEXT432(0);
    *(undefined1 (*) [32])(sgd + 0x58) = ZEXT432(0);
joined_r0x00128d13:
    if ((LookupParameter *)am._0_8_ != pLVar2) {
LAB_00128e38:
      operator_delete((void *)am._0_8_);
    }
    break;
  case 3:
    sgd = (Trainer *)operator_new(0xa8);
    *(undefined8 *)(sgd + 8) = 0x3f8000003f800000;
    *(undefined8 *)(sgd + 0x10) = 0;
    sgd[0x18] = (Trainer)0x1;
    *(undefined4 *)(sgd + 0x1c) = 0x40a00000;
    *(undefined1 (*) [16])(sgd + 0x20) = ZEXT816(0) << 0x20;
    *(undefined2 *)(sgd + 0x30) = 1;
    *(Model **)(sgd + 0x38) = &model;
    *(code **)sgd = __cxa_finalize;
    *(undefined8 *)(sgd + 0x40) = 0x3f733333358637bd;
    *(undefined1 (*) [64])(sgd + 0x48) = ZEXT864(0) << 0x20;
    *(undefined1 (*) [64])(sgd + 0x68) = ZEXT864(0) << 0x20;
    break;
  case 4:
    sgd = (Trainer *)operator_new(0xb0);
    am._0_8_ = pLVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&am,"lr_eta","");
    paVar19 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    pfVar30 = boost::any_cast<float_const&>(paVar19);
    fVar3 = *pfVar30;
    *(float *)(sgd + 8) = fVar3;
    *(float *)(sgd + 0xc) = fVar3;
    *(undefined8 *)(sgd + 0x10) = 0;
    sgd[0x18] = (Trainer)0x1;
    *(undefined4 *)(sgd + 0x1c) = 0x40a00000;
    *(undefined8 *)(sgd + 0x20) = 0;
    *(undefined8 *)(sgd + 0x28) = 0;
    *(undefined2 *)(sgd + 0x30) = 1;
    *(Model **)(sgd + 0x38) = &model;
    *(code **)sgd = boost::serialization::extended_type_info::key_unregister;
    *(undefined8 *)(sgd + 0x40) = 0x3f7fbe773f666666;
    *(undefined4 *)(sgd + 0x48) = 0x322bcc77;
    *(undefined1 (*) [64])(sgd + 0x50) = ZEXT864(0) << 0x20;
    *(undefined1 (*) [64])(sgd + 0x70) = ZEXT864(0) << 0x20;
joined_r0x00128c61:
    if ((LookupParameter *)am._0_8_ == pLVar2) break;
    goto LAB_00128e38;
  default:
    sgd = (Trainer *)0x0;
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"lr_eta_decay","");
  paVar19 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
  pfVar30 = boost::any_cast<float_const&>(paVar19);
  *(float *)(sgd + 0x10) = *pfVar30;
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"sparse_updates","");
  paVar19 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
  pTVar31 = (Trainer *)boost::any_cast<bool_const&>(paVar19);
  TVar16 = *pTVar31;
  sgd[0x30] = TVar16;
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
    TVar16 = sgd[0x30];
  }
  if (((byte)TVar16 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Sparse updates for lookup parameter(s) to be disabled!",0x36);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"%% Using ",9);
  poVar24 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,flavour._M_dataplus._M_p,flavour._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar24," recurrent units",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar24 + -0x18) + (char)poVar24);
  std::ostream::put((char)poVar24);
  std::ostream::flush();
  _global_fertility = local_5c0 == p_Var1;
  dynet::AttentionalModel<dynet::GRUBuilder>::AttentionalModel
            (&am,&model,SRC_VOCAB_SIZE,TGT_VOCAB_SIZE,LAYERS,HIDDEN_DIM,ALIGN_DIM,
             local_640 != p_Var1,bVar35,SUB81(local_648,0),SUB81(local_650,0),local_678 != p_Var1,
             _global_fertility);
  local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"test","");
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)this,&local_698);
  if (cVar18._M_node == p_Var1) {
    bVar35 = false;
  }
  else {
    local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_670,"rescore","");
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)this,&local_670);
    bVar35 = cVar18._M_node != p_Var1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_670._M_dataplus._M_p != &local_670.field_2) {
      operator_delete(local_670._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p);
  }
  if (bVar35) {
    dynet::AttentionalModel<dynet::GRUBuilder>::add_fertility_params
              (&am,&model,HIDDEN_DIM,local_640 != p_Var1);
  }
  local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"initialise","");
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)this,&local_698);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p);
  }
  if (cVar18._M_node != p_Var1) {
    local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"initialise","");
    paVar19 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    pbVar23 = boost::any_cast<std::__cxx11::string_const&>(paVar19);
    initialise(&model,pbVar23);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_698._M_dataplus._M_p != &local_698.field_2) {
      operator_delete(local_698._M_dataplus._M_p);
    }
  }
  if (!bVar35 && !_global_fertility) {
    dynet::AttentionalModel<dynet::GRUBuilder>::add_fertility_params
              (&am,&model,HIDDEN_DIM,local_640 != p_Var1);
  }
  local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"test","");
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)this,&local_698);
  if (cVar18._M_node == p_Var1) {
    local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_670,"kbest","");
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)this,&local_670);
    if (cVar18._M_node == p_Var1) {
      local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"fert-stats","");
      cVar18 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       *)this,&local_5b8);
      bVar35 = cVar18._M_node == p_Var1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p);
      }
    }
    else {
      bVar35 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_670._M_dataplus._M_p != &local_670.field_2) {
      operator_delete(local_670._M_dataplus._M_p);
    }
  }
  else {
    bVar35 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p);
  }
  if (bVar35) {
    local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_578,fname._M_dataplus._M_p,
               fname._M_dataplus._M_p + fname._M_string_length);
    local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"curriculum","");
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)this,&local_698);
    local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_670,"epochs","");
    paVar19 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    piVar32 = boost::any_cast<int_const&>(paVar19);
    iVar5 = *piVar32;
    local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"coverage","");
    paVar19 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    pfVar30 = boost::any_cast<float_const&>(paVar19);
    fVar3 = *pfVar30;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"display","");
    cVar21 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)this,&local_70);
    train<dynet::AttentionalModel<dynet::GRUBuilder>>
              (&model,&am,&local_5d8,&local_618,sgd,&local_578,cVar18._M_node != p_Var1,iVar5,
               local_678 != p_Var1,fVar3,cVar21._M_node != p_Var1,local_5c0 != p_Var1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
      operator_delete(local_5b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_670._M_dataplus._M_p != &local_670.field_2) {
      operator_delete(local_670._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_698._M_dataplus._M_p != &local_698.field_2) {
      operator_delete(local_698._M_dataplus._M_p);
    }
    _Var34._M_p = local_578._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578._M_dataplus._M_p == &local_578.field_2) goto LAB_001295d3;
  }
  else {
    local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"kbest","");
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)this,&local_698);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_698._M_dataplus._M_p != &local_698.field_2) {
      operator_delete(local_698._M_dataplus._M_p);
    }
    local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
    if (cVar18._M_node == p_Var1) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"test","");
      cVar18 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       *)this,&local_698);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_698._M_dataplus._M_p != &local_698.field_2) {
        operator_delete(local_698._M_dataplus._M_p);
      }
      local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
      if (cVar18._M_node == p_Var1) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"fert-stats","");
        cVar18 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                         *)this,&local_698);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_698._M_dataplus._M_p != &local_698.field_2) {
          operator_delete(local_698._M_dataplus._M_p);
        }
        if (cVar18._M_node == p_Var1) goto LAB_001295d3;
        local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"fertility","");
        cVar18 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                         *)this,&local_698);
        fert_stats<dynet::AttentionalModel<dynet::GRUBuilder>>
                  (&model,&am,&local_618,cVar18._M_node != p_Var1);
        _Var34._M_p = local_698._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_698._M_dataplus._M_p == &local_698.field_2) goto LAB_001295d3;
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"rescore","");
        cVar18 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                         *)this,&local_698);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_698._M_dataplus._M_p != &local_698.field_2) {
          operator_delete(local_698._M_dataplus._M_p);
        }
        if (cVar18._M_node != p_Var1) {
          test_rescore<dynet::AttentionalModel<dynet::GRUBuilder>>
                    (&model,&am,&local_5f8,local_678 != p_Var1);
          goto LAB_001295d3;
        }
        local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"test","");
        paVar19 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
        pbVar23 = boost::any_cast<std::__cxx11::string_const&>(paVar19);
        pcVar10 = (pbVar23->_M_dataplus)._M_p;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar10,pcVar10 + pbVar23->_M_string_length);
        local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_670,"beam","");
        paVar19 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
        puVar20 = boost::any_cast<unsigned_int_const&>(paVar19);
        test_decode<dynet::AttentionalModel<dynet::GRUBuilder>>
                  (&model,&am,&local_b0,local_678 != p_Var1,*puVar20);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_670._M_dataplus._M_p != &local_670.field_2) {
          operator_delete(local_670._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        _Var34._M_p = local_698._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_698._M_dataplus._M_p == &local_698.field_2) goto LAB_001295d3;
      }
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"kbest","");
      paVar19 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
      pbVar23 = boost::any_cast<std::__cxx11::string_const&>(paVar19);
      pcVar10 = (pbVar23->_M_dataplus)._M_p;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar10,pcVar10 + pbVar23->_M_string_length);
      local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_670,"topk","");
      paVar19 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
      puVar20 = boost::any_cast<unsigned_int_const&>(paVar19);
      test_kbest_arcs<dynet::AttentionalModel<dynet::GRUBuilder>>(&model,&am,&local_90,*puVar20);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_670._M_dataplus._M_p != &local_670.field_2) {
        operator_delete(local_670._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      _Var34._M_p = local_698._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_698._M_dataplus._M_p == &local_698.field_2) goto LAB_001295d3;
    }
  }
  operator_delete(_Var34._M_p);
LAB_001295d3:
  (**(code **)(*(long *)sgd + 8))(sgd);
  dynet::AttentionalModel<dynet::GRUBuilder>::~AttentionalModel(&am);
  dynet::Model::~Model(&model);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fname._M_dataplus._M_p != &fname.field_2) {
    operator_delete(fname._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)line._M_dataplus._M_p != &line.field_2) {
    operator_delete(line._M_dataplus._M_p);
  }
  std::
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::~vector(&local_5f8);
  std::
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::~vector(&local_618);
  std::
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::~vector(&local_5d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)flavour._M_dataplus._M_p != &flavour.field_2) {
    operator_delete(flavour._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int main_body(variables_map vm)
{
    kSRC_SOS = sd.convert("<s>");
    kSRC_EOS = sd.convert("</s>");
    kTGT_SOS = td.convert("<s>");
    kTGT_EOS = td.convert("</s>");
    verbose = vm.count("verbose");

    LAYERS = vm["layers"].as<int>(); 
    ALIGN_DIM = vm["align"].as<int>(); 
    HIDDEN_DIM = vm["hidden"].as<int>(); 
    bool bidir = vm.count("bidirectional");
    bool giza = vm.count("giza");
    bool giza_pos = giza || vm.count("gz-position");
    bool giza_markov = giza || vm.count("gz-markov");
    bool giza_fert = giza || vm.count("gz-fertility");
    bool fert = vm.count("fertility");
    bool swap = vm.count("swap");
    bool doco = vm.count("document");
    string flavour = "RNN";
    if (vm.count("lstm"))	flavour = "LSTM";
    else if (vm.count("gru"))	flavour = "GRU";

    Corpus training, devel, testing;
    string line;
    cerr << "Reading training data from " << vm["train"].as<string>() << "...\n";
    training = read_corpus(vm["train"].as<string>(), doco);
    sd.freeze(); // no new word types allowed
    td.freeze(); // no new word types allowed
    
    SRC_VOCAB_SIZE = sd.size();
    TGT_VOCAB_SIZE = td.size();

    if (vm.count("devel")) {
	cerr << "Reading dev data from " << vm["devel"].as<string>() << "...\n";
	devel = read_corpus(vm["devel"].as<string>(), doco);
    }

    if (vm.count("test") && vm.count("rescore")) {
        // otherwise "test" file is assumed just to contain source language strings
        cerr << "Reading test examples from " << vm["test"].as<string>() << endl;
        testing = read_corpus(vm["test"].as<string>(), doco);
    }

    if (swap) {
	cerr << "Swapping role of source and target\n";
        std::swap(sd, td);
        std::swap(kSRC_SOS, kTGT_SOS);
        std::swap(kSRC_EOS, kTGT_EOS);
        std::swap(SRC_VOCAB_SIZE, TGT_VOCAB_SIZE);
        for (auto &sent: training)
            std::swap(get<0>(sent), get<1>(sent));
        for (auto &sent: devel)
            std::swap(get<0>(sent), get<1>(sent));
        for (auto &sent: testing)
            std::swap(get<0>(sent), get<1>(sent));
    }

    string fname;
    if (vm.count("parameters"))
    	fname = vm["parameters"].as<string>();
    else if (vm.count("initialise"))
    	fname = vm["initialise"].as<string>();
    else {
		ostringstream os;
		os << "am"
			<< '_' << LAYERS
			<< '_' << HIDDEN_DIM
			<< '_' << ALIGN_DIM
			<< '_' << flavour
			<< "_b" << bidir
			<< "_g" << (int)giza_pos << (int)giza_markov << (int)giza_fert
			<< "_d" << doco
			<< "-pid" << getpid() << ".params";
		fname = os.str();
	}

	cerr << "Parameters will be written to: " << fname << endl;

   Model model;
   Trainer* sgd = nullptr;
   unsigned sgd_type = vm["sgd_trainer"].as<unsigned>();
   if (sgd_type == 1)
       sgd = new MomentumSGDTrainer(model, vm["lr_eta"].as<float>());
   else if (sgd_type == 2)
       sgd = new AdagradTrainer(model, vm["lr_eta"].as<float>());
   else if (sgd_type == 3)
       sgd = new AdadeltaTrainer(model);
   else if (sgd_type == 4)
       sgd = new AdamTrainer(model, vm["lr_eta"].as<float>());
   else if (sgd_type == 0)//Vanilla SGD trainer
       sgd = new SimpleSGDTrainer(model, vm["lr_eta"].as<float>());
   else
       assert("Unknown SGD trainer type! (0: vanilla SGD; 1: momentum SGD; 2: Adagrad; 3: AdaDelta; 4: Adam)");
   sgd->eta_decay = vm["lr_eta_decay"].as<float>();
   sgd->sparse_updates_enabled = vm["sparse_updates"].as<bool>();
   if (!sgd->sparse_updates_enabled)
      cerr << "Sparse updates for lookup parameter(s) to be disabled!" << endl;

   cerr << "%% Using " << flavour << " recurrent units" << endl;
   AttentionalModel<rnn_t> am(&model, SRC_VOCAB_SIZE, TGT_VOCAB_SIZE,
	    LAYERS, HIDDEN_DIM, ALIGN_DIM, bidir, giza_pos, giza_markov, giza_fert, doco, !fert);

   bool add_fer = false;
   if (vm.count("test") && vm.count("rescore"))
   {
	   am.add_fertility_params(&model, HIDDEN_DIM, bidir);
	   add_fer = true;
   }

   if (vm.count("initialise")) initialise(model, vm["initialise"].as<string>());

   if (fert && !add_fer) am.add_fertility_params(&model, HIDDEN_DIM, bidir);

   if (!vm.count("test") && !vm.count("kbest") && !vm.count("fert-stats"))
    	train(model, am, training, devel, *sgd, fname, vm.count("curriculum"),
                vm["epochs"].as<int>(), doco, vm["coverage"].as<float>(), vm.count("display"),
                fert);
    else if (vm.count("kbest"))
    	test_kbest_arcs(model, am, vm["kbest"].as<string>(), vm["topk"].as<unsigned>());
    else if (vm.count("test")) {
        if (vm.count("rescore"))
            test_rescore(model, am, testing, doco);
        else // test
            test_decode(model, am, vm["test"].as<string>(), doco, vm["beam"].as<unsigned>());
    }
    else if (vm.count("fert-stats"))
        fert_stats(model, am, devel, vm.count("fertility"));

    delete sgd;

    //dynet::Free();

    return EXIT_SUCCESS;
}